

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdef.c
# Opt level: O1

void mdef_report(mdef_t *m)

{
  err_msg(ERR_INFO,(char *)0x0,0,"Initialization of mdef_t, report:\n");
  err_msg(ERR_INFO,(char *)0x0,0,
          "%d CI-phone, %d CD-phone, %d emitstate/phone, %d CI-sen, %d Sen, %d Sen-Seq\n",
          (ulong)(uint)m->n_ciphone,(ulong)(uint)(m->n_phone - m->n_ciphone),
          (ulong)(uint)m->n_emit_state,(ulong)(uint)m->n_ci_sen,(ulong)(uint)m->n_sen,
          (ulong)(uint)m->n_sseq);
  err_msg(ERR_INFO,(char *)0x0,0,"\n");
  return;
}

Assistant:

void
mdef_report(mdef_t * m)
{
    E_INFO_NOFN("Initialization of mdef_t, report:\n");
    E_INFO_NOFN
        ("%d CI-phone, %d CD-phone, %d emitstate/phone, %d CI-sen, %d Sen, %d Sen-Seq\n",
         m->n_ciphone, m->n_phone - m->n_ciphone, m->n_emit_state,
         m->n_ci_sen, m->n_sen, m->n_sseq);
    E_INFO_NOFN("\n");

}